

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_base.hpp
# Opt level: O0

void boost::detail::function::
     functor_manager<boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>_>_>
     ::manage(function_buffer *in_buffer,function_buffer *out_buffer,
             functor_manager_operation_type op)

{
  int in_EDX;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  
  if (in_EDX == 4) {
    *in_RSI = &algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>::
               typeinfo;
    *(undefined1 *)(in_RSI + 1) = 0;
    *(undefined1 *)((long)in_RSI + 9) = 0;
  }
  else {
    manager(in_RDI,in_RSI,in_EDX);
  }
  return;
}

Assistant:

static inline void
        manage(const function_buffer& in_buffer, function_buffer& out_buffer, 
               functor_manager_operation_type op)
        {
          typedef typename get_function_tag<functor_type>::type tag_type;
          switch (op) {
          case get_functor_type_tag:
            out_buffer.type.type = &BOOST_SP_TYPEID(functor_type);
            out_buffer.type.const_qualified = false;
            out_buffer.type.volatile_qualified = false;
            return;

          default:
            manager(in_buffer, out_buffer, op, tag_type());
            return;
          }
        }